

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O1

void amrex::average_face_to_cellcenter(MultiFab *cc,Array<const_MultiFab_*,_3> *fc,Geometry *geom)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  Box bx;
  MFIter mfi;
  int local_21c;
  Box local_1ac;
  Array4<double> local_190;
  Array4<const_double> local_150;
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  MFIter::MFIter(&local_90,(FabArrayBase *)cc,true);
  if (local_90.currentIndex < local_90.endIndex) {
    do {
      MFIter::tilebox(&local_1ac,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_190,&cc->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_d0,&fc->_M_elems[0]->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_110,&fc->_M_elems[1]->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_150,&fc->_M_elems[2]->super_FabArray<amrex::FArrayBox>,&local_90);
      if (local_1ac.smallend.vect[2] <= local_1ac.bigend.vect[2]) {
        lVar5 = (long)local_1ac.smallend.vect[1];
        lVar2 = (long)local_1ac.smallend.vect[0] * 8;
        iVar1 = local_1ac.smallend.vect[2];
        local_21c = local_1ac.smallend.vect[2];
        do {
          local_21c = local_21c + 1;
          if (local_1ac.smallend.vect[1] <= local_1ac.bigend.vect[1]) {
            lVar4 = (long)iVar1;
            lVar6 = (long)local_190.begin.x;
            lVar17 = local_190.jstride * 8;
            lVar7 = (lVar5 - local_190.begin.y) * lVar17 +
                    (lVar4 - local_190.begin.z) * local_190.kstride * 8;
            lVar10 = (long)local_190.p + lVar7 + lVar6 * -8 + lVar2;
            lVar15 = (long)local_190.p + local_190.nstride * 8 + lVar7 + lVar6 * -8 + lVar2;
            lVar9 = (long)local_190.p + local_190.nstride * 0x10 + lVar7 + lVar6 * -8 + lVar2;
            lVar12 = local_150.jstride * 8;
            lVar7 = (lVar5 - local_150.begin.y) * lVar12;
            lVar6 = (long)local_150.p +
                    (long)(local_21c - local_150.begin.z) * local_150.kstride * 8 + lVar7 +
                    (long)local_150.begin.x * -8 + lVar2;
            lVar11 = (long)local_150.p +
                     (lVar4 - local_150.begin.z) * local_150.kstride * 8 + lVar7 +
                     (long)local_150.begin.x * -8 + lVar2;
            lVar13 = local_110.jstride * 8;
            lVar8 = (lVar4 - local_110.begin.z) * local_110.kstride;
            lVar14 = (long)local_110.p +
                     (lVar5 - local_110.begin.y) * lVar13 + lVar8 * 8 + (long)local_110.begin.x * -8
                     + lVar2;
            iVar3 = (local_1ac.smallend.vect[1] + 1) - local_110.begin.y;
            lVar4 = (long)local_d0.p +
                    (lVar5 - local_d0.begin.y) * local_d0.jstride * 8 +
                    (lVar4 - local_d0.begin.z) * local_d0.kstride * 8 + (long)local_d0.begin.x * -8
                    + lVar2 + 8;
            lVar7 = lVar5;
            do {
              if (local_1ac.smallend.vect[0] <= local_1ac.bigend.vect[0]) {
                lVar16 = 0;
                do {
                  *(double *)(lVar10 + lVar16 * 8) =
                       (*(double *)(lVar4 + -8 + lVar16 * 8) + *(double *)(lVar4 + lVar16 * 8)) *
                       0.5;
                  *(double *)(lVar15 + lVar16 * 8) =
                       (*(double *)(lVar14 + lVar16 * 8) +
                       *(double *)
                        ((long)local_110.p +
                        lVar16 * 8 +
                        iVar3 * lVar13 + lVar8 * 8 + (long)local_110.begin.x * -8 + lVar2)) * 0.5;
                  *(double *)(lVar9 + lVar16 * 8) =
                       (*(double *)(lVar11 + lVar16 * 8) + *(double *)(lVar6 + lVar16 * 8)) * 0.5;
                  lVar16 = lVar16 + 1;
                } while ((local_1ac.bigend.vect[0] - local_1ac.smallend.vect[0]) + 1 != (int)lVar16)
                ;
              }
              lVar7 = lVar7 + 1;
              lVar10 = lVar10 + lVar17;
              lVar15 = lVar15 + lVar17;
              lVar9 = lVar9 + lVar17;
              lVar6 = lVar6 + lVar12;
              lVar11 = lVar11 + lVar12;
              lVar14 = lVar14 + lVar13;
              iVar3 = iVar3 + 1;
              lVar4 = lVar4 + local_d0.jstride * 8;
            } while (local_1ac.bigend.vect[1] + 1 != (int)lVar7);
          }
          bVar18 = iVar1 != local_1ac.bigend.vect[2];
          iVar1 = iVar1 + 1;
        } while (bVar18);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void average_face_to_cellcenter (MultiFab& cc,
                                     const Array<const MultiFab*,AMREX_SPACEDIM>& fc,
                                     const Geometry& geom)
    {
        AMREX_ASSERT(cc.nComp() >= AMREX_SPACEDIM);
        AMREX_ASSERT(fc[0]->nComp() == 1); // We only expect fc to have the gradient perpendicular to the face

        const GeometryData gd = geom.data();
        amrex::ignore_unused(gd);

#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion() && cc.isFusingCandidate()) {
            auto const& ccma = cc.arrays();
            AMREX_D_TERM(auto const& fxma = fc[0]->const_arrays();,
                         auto const& fyma = fc[1]->const_arrays();,
                         auto const& fzma = fc[2]->const_arrays(););
            ParallelFor(cc,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
            {
                amrex_avg_fc_to_cc(i,j,k, ccma[box_no], AMREX_D_DECL(fxma[box_no],
                                                                     fyma[box_no],
                                                                     fzma[box_no]),
                                   0
#if (AMREX_SPACEDIM == 1)
                                   , gd
#endif
                                   );
            });
            Gpu::streamSynchronize();
        } else
#endif
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(cc,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                const Box bx = mfi.tilebox();
                Array4<Real> const& ccarr = cc.array(mfi);
                AMREX_D_TERM(Array4<Real const> const& fxarr = fc[0]->const_array(mfi);,
                             Array4<Real const> const& fyarr = fc[1]->const_array(mfi);,
                             Array4<Real const> const& fzarr = fc[2]->const_array(mfi););

#if (AMREX_SPACEDIM == 1)
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D( bx, i, j, k,
                {
                    amrex_avg_fc_to_cc(i,j,k, ccarr, fxarr, 0, gd);
                });
#else
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D( bx, i, j, k,
                {
                    amrex_avg_fc_to_cc(i,j,k, ccarr, AMREX_D_DECL(fxarr,fyarr,fzarr), 0);
                });
#endif
            }
        }
    }